

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_interface.cc
# Opt level: O0

void __thiscall
sentencepiece::ModelInterface::ModelInterface(ModelInterface *this,ModelProto *model_proto)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__ModelInterface_006f1490;
  in_RDI[1] = in_RSI;
  std::
  unique_ptr<sentencepiece::normalizer::PrefixMatcher,std::default_delete<sentencepiece::normalizer::PrefixMatcher>>
  ::unique_ptr<std::default_delete<sentencepiece::normalizer::PrefixMatcher>,void>
            ((unique_ptr<sentencepiece::normalizer::PrefixMatcher,_std::default_delete<sentencepiece::normalizer::PrefixMatcher>_>
              *)(in_RDI + 2));
  std::
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::unordered_map((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                   *)0x46c920);
  std::
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::unordered_map((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                   *)0x46c933);
  *(undefined4 *)(in_RDI + 0x11) = 0;
  util::OkStatus();
  return;
}

Assistant:

ModelInterface::ModelInterface(const ModelProto &model_proto)
    : model_proto_(&model_proto), status_(util::OkStatus()) {}